

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void read_string(LexState *ls,int del,SemInfo *seminfo)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  TString *pTVar4;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_30;
  uint local_28;
  int local_24;
  int c;
  SemInfo *seminfo_local;
  int del_local;
  LexState *ls_local;
  
  save(ls,ls->current);
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_28 = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_28 = (uint)*pbVar3;
  }
  ls->current = local_28;
LAB_00187255:
  while( true ) {
    if (ls->current == del) {
      save(ls,ls->current);
      sVar2 = ls->z->n;
      ls->z->n = sVar2 - 1;
      if (sVar2 == 0) {
        local_4c = luaZ_fill(ls->z);
      }
      else {
        pbVar3 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar3 + 1);
        local_4c = (uint)*pbVar3;
      }
      ls->current = local_4c;
      pTVar4 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
      seminfo->ts = pTVar4;
      return;
    }
    iVar1 = ls->current;
    if (iVar1 == -1) {
      lexerror(ls,"unfinished string",0x122);
    }
    if ((iVar1 == 10) || (iVar1 == 0xd)) {
      lexerror(ls,"unfinished string",0x126);
    }
    if (iVar1 == 0x5c) break;
    save(ls,ls->current);
    sVar2 = ls->z->n;
    ls->z->n = sVar2 - 1;
    if (sVar2 == 0) {
      local_48 = luaZ_fill(ls->z);
    }
    else {
      pbVar3 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar3 + 1);
      local_48 = (uint)*pbVar3;
    }
    ls->current = local_48;
  }
  save(ls,ls->current);
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_30 = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_30 = (uint)*pbVar3;
  }
  ls->current = local_30;
  switch(ls->current) {
  default:
    esccheck(ls,""[ls->current + 1] & 2,"invalid escape sequence");
    local_24 = readdecesc(ls);
    goto LAB_00187572;
  case 10:
  case 0xd:
    inclinenumber(ls);
    local_24 = 10;
    goto LAB_00187572;
  case 0x22:
  case 0x27:
  case 0x5c:
    local_24 = ls->current;
    break;
  case 0x61:
    local_24 = 7;
    break;
  case 0x62:
    local_24 = 8;
    break;
  case 0x66:
    local_24 = 0xc;
    break;
  case 0x6e:
    local_24 = 10;
    break;
  case 0x72:
    local_24 = 0xd;
    break;
  case 0x74:
    local_24 = 9;
    break;
  case 0x75:
    utf8esc(ls);
    goto LAB_00187255;
  case 0x76:
    local_24 = 0xb;
    break;
  case 0x78:
    local_24 = readhexaesc(ls);
    break;
  case 0x7a:
    goto switchD_0018734a_caseD_7a;
  case -1:
    goto LAB_00187255;
  }
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_44 = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_44 = (uint)*pbVar3;
  }
  ls->current = local_44;
LAB_00187572:
  ls->buff->n = ls->buff->n - 1;
  save(ls,local_24);
  goto LAB_00187255;
switchD_0018734a_caseD_7a:
  ls->buff->n = ls->buff->n - 1;
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_3c = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_3c = (uint)*pbVar3;
  }
  ls->current = local_3c;
  while ((""[ls->current + 1] & 8) != 0) {
    if ((ls->current == 10) || (ls->current == 0xd)) {
      inclinenumber(ls);
    }
    else {
      sVar2 = ls->z->n;
      ls->z->n = sVar2 - 1;
      if (sVar2 == 0) {
        local_40 = luaZ_fill(ls->z);
      }
      else {
        pbVar3 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar3 + 1);
        local_40 = (uint)*pbVar3;
      }
      ls->current = local_40;
    }
  }
  goto LAB_00187255;
}

Assistant:

static void read_string (LexState *ls, int del, SemInfo *seminfo) {
  save_and_next(ls);  /* keep delimiter (for error messages) */
  while (ls->current != del) {
    switch (ls->current) {
      case EOZ:
        lexerror(ls, "unfinished string", TK_EOS);
        break;  /* to avoid warnings */
      case '\n':
      case '\r':
        lexerror(ls, "unfinished string", TK_STRING);
        break;  /* to avoid warnings */
      case '\\': {  /* escape sequences */
        int c;  /* final character to be saved */
        save_and_next(ls);  /* keep '\\' for error messages */
        switch (ls->current) {
          case 'a': c = '\a'; goto read_save;
          case 'b': c = '\b'; goto read_save;
          case 'f': c = '\f'; goto read_save;
          case 'n': c = '\n'; goto read_save;
          case 'r': c = '\r'; goto read_save;
          case 't': c = '\t'; goto read_save;
          case 'v': c = '\v'; goto read_save;
          case 'x': c = readhexaesc(ls); goto read_save;
          case 'u': utf8esc(ls);  goto no_save;
          case '\n': case '\r':
            inclinenumber(ls); c = '\n'; goto only_save;
          case '\\': case '\"': case '\'':
            c = ls->current; goto read_save;
          case EOZ: goto no_save;  /* will raise an error next loop */
          case 'z': {  /* zap following span of spaces */
            luaZ_buffremove(ls->buff, 1);  /* remove '\\' */
            next(ls);  /* skip the 'z' */
            while (lisspace(ls->current)) {
              if (currIsNewline(ls)) inclinenumber(ls);
              else next(ls);
            }
            goto no_save;
          }
          default: {
            esccheck(ls, lisdigit(ls->current), "invalid escape sequence");
            c = readdecesc(ls);  /* digital escape '\ddd' */
            goto only_save;
          }
        }
       read_save:
         next(ls);
         /* go through */
       only_save:
         luaZ_buffremove(ls->buff, 1);  /* remove '\\' */
         save(ls, c);
         /* go through */
       no_save: break;
      }
      default:
        save_and_next(ls);
    }
  }
  save_and_next(ls);  /* skip delimiter */
  seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + 1,
                                   luaZ_bufflen(ls->buff) - 2);
}